

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_acct_resp(Curl_easy *data,int ftpcode)

{
  connectdata *conn;
  CURLcode CVar1;
  
  if (ftpcode != 0xe6) {
    Curl_failf(data,"ACCT rejected by server: %03d",(ulong)(uint)ftpcode);
    return CURLE_FTP_WEIRD_PASS_REPLY;
  }
  conn = data->conn;
  if (((conn->bits).field_0x2 & 4) == 0) {
    CVar1 = ftp_state_pwd(data,conn);
    return CVar1;
  }
  CVar1 = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"PBSZ %d",0);
  if (CVar1 == CURLE_OK) {
    _ftp_state(data,'\x06');
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

static CURLcode ftp_state_acct_resp(struct Curl_easy *data,
                                    int ftpcode)
{
  CURLcode result = CURLE_OK;
  if(ftpcode != 230) {
    failf(data, "ACCT rejected by server: %03d", ftpcode);
    result = CURLE_FTP_WEIRD_PASS_REPLY; /* FIX */
  }
  else
    result = ftp_state_loggedin(data);

  return result;
}